

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeomObj.cpp
# Opt level: O2

void __thiscall GeometricObject::find_texture(GeometricObject *this,Vector *p,SurfaceData *t)

{
  Map *pMVar1;
  Texture *pTVar2;
  Texture **ppTVar3;
  double local_38;
  double dStack_30;
  double local_28;
  
  Grayzer::SurfaceData::operator=(t,&this->def_material);
  (*this->_vptr_GeometricObject[3])(&local_38,this,p);
  (t->n).x = local_38;
  (t->n).y = dStack_30;
  (t->n).z = local_28;
  pMVar1 = this->mapping;
  if (pMVar1 != (Map *)0x0) {
    (**(code **)(*(long *)pMVar1 + 0x10))(&local_38,pMVar1,p);
    (t->map_coord).x = local_38;
    (t->map_coord).y = dStack_30;
    (t->map_coord).z = local_28;
  }
  ppTVar3 = &this->material;
  while (pTVar2 = *ppTVar3, pTVar2 != (Texture *)0x0) {
    (*pTVar2->_vptr_Texture[2])(pTVar2,p,t);
    ppTVar3 = &pTVar2->next;
  }
  return;
}

Assistant:

void GeometricObject::find_texture(Vector& p, SurfaceData& t)
{
    Texture *m;

    t = def_material;
    t.n = find_normal(p);

    if(mapping) t.map_coord = mapping->apply(p);

    for( m = material; m != 0; m = m->next) m->apply(p,t);
}